

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

string * __thiscall
leveldb::DBTest::AllEntriesFor_abi_cxx11_
          (string *__return_storage_ptr__,DBTest *this,Slice *user_key)

{
  Comparator *pCVar1;
  bool bVar2;
  int iVar3;
  Iterator *pIVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined4 extraout_var_00;
  ulong extraout_RDX;
  long extraout_RDX_00;
  ParsedInternalKey ikey;
  InternalKey target;
  string local_98;
  Status local_70 [2];
  char local_60 [16];
  string local_50;
  undefined4 extraout_var;
  
  pIVar4 = DBImpl::TEST_NewInternalIterator((DBImpl *)this->db_);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = user_key->data_;
  local_98._M_string_length = user_key->size_;
  local_98.field_2._M_allocated_capacity = 0xffffffffffffff;
  local_98.field_2._8_4_ = 1;
  AppendInternalKey(&local_50,(ParsedInternalKey *)&local_98);
  if (local_50._M_string_length == 0) {
    __assert_fail("!rep_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                  ,0x96,"Slice leveldb::InternalKey::Encode() const");
  }
  local_98._M_dataplus._M_p = local_50._M_dataplus._M_p;
  local_98._M_string_length = local_50._M_string_length;
  (*pIVar4->_vptr_Iterator[5])(pIVar4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*pIVar4->_vptr_Iterator[10])(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x17cd49);
    iVar3 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
    if ((char)iVar3 != '\0') {
      bVar2 = true;
      do {
        local_98._M_dataplus._M_p = "";
        local_98._M_string_length = 0;
        iVar3 = (*pIVar4->_vptr_Iterator[8])(pIVar4);
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(extraout_var,iVar3);
        if (extraout_RDX < 8) {
LAB_00130cfe:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          local_98.field_2._8_4_ =
               (uint)*(ulong *)(paVar5->_M_local_buf + (extraout_RDX - 8)) & 0xff;
          local_98.field_2._M_allocated_capacity =
               *(ulong *)(paVar5->_M_local_buf + (extraout_RDX - 8)) >> 8;
          local_98._M_string_length = extraout_RDX - 8;
          local_98._M_dataplus._M_p = (pointer)paVar5;
          if (1 < (uint)local_98.field_2._8_4_) goto LAB_00130cfe;
          pCVar1 = (this->last_options_).comparator;
          iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_98,user_key);
          if (iVar3 != 0) break;
          if (!bVar2) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if (local_98.field_2._8_4_ == 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else if (local_98.field_2._8_4_ == 1) {
            iVar3 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
            local_70[0].state_ = local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,CONCAT44(extraout_var_00,iVar3),
                       extraout_RDX_00 + CONCAT44(extraout_var_00,iVar3));
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_70[0].state_);
            if (local_70[0].state_ != local_60) {
              operator_delete(local_70[0].state_);
            }
          }
          bVar2 = false;
        }
        (*pIVar4->_vptr_Iterator[6])(pIVar4);
        iVar3 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
      } while ((char)iVar3 != '\0');
      if (!bVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    operator_delete__(local_98._M_dataplus._M_p);
    (*pIVar4->_vptr_Iterator[10])(local_70,pIVar4);
    Status::ToString_abi_cxx11_(&local_98,local_70);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_70[0].state_ != (char *)0x0) {
      operator_delete__(local_70[0].state_);
    }
  }
  (*pIVar4->_vptr_Iterator[1])(pIVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AllEntriesFor(const Slice& user_key) {
    Iterator* iter = dbfull()->TEST_NewInternalIterator();
    InternalKey target(user_key, kMaxSequenceNumber, kTypeValue);
    iter->Seek(target.Encode());
    std::string result;
    if (!iter->status().ok()) {
      result = iter->status().ToString();
    } else {
      result = "[ ";
      bool first = true;
      while (iter->Valid()) {
        ParsedInternalKey ikey;
        if (!ParseInternalKey(iter->key(), &ikey)) {
          result += "CORRUPTED";
        } else {
          if (last_options_.comparator->Compare(ikey.user_key, user_key) != 0) {
            break;
          }
          if (!first) {
            result += ", ";
          }
          first = false;
          switch (ikey.type) {
            case kTypeValue:
              result += iter->value().ToString();
              break;
            case kTypeDeletion:
              result += "DEL";
              break;
          }
        }
        iter->Next();
      }
      if (!first) {
        result += " ";
      }
      result += "]";
    }
    delete iter;
    return result;
  }